

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell::
~TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell
          (TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell *this)

{
  TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell *this_local;
  
  ~TEST_MockExpectedCall_callOrderIsFulfilledMultiple_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callOrderIsFulfilledMultiple)
{
    MockCheckedExpectedCall expectedCall(4);
    expectedCall.withName("name");
    expectedCall.withCallOrder(150, 153);
    expectedCall.callWasMade(150);
    expectedCall.callWasMade(151);
    expectedCall.callWasMade(152);
    expectedCall.callWasMade(153);
    CHECK(expectedCall.isFulfilled());
    CHECK_FALSE(expectedCall.isOutOfOrder());
}